

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::PutDeferred
          (SscWriterGeneric *this,VariableBase *variable,void *data)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  vector<char,_std::allocator<char>_> *this_00;
  void *in_RDX;
  long in_RSI;
  size_t in_RDI;
  value_type *b_3;
  BlockInfo *b_2;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  bool found;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  value_type *b_1;
  BlockInfo *b;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  bool found_1;
  string *dataString;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_fffffffffffffc08;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_fffffffffffffc10;
  allocator *paVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc54;
  string *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  string *component;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffca8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcb0;
  allocator *in_stack_fffffffffffffcd8;
  Buffer *in_stack_fffffffffffffce0;
  ShapeID *in_stack_fffffffffffffce8;
  Dims *in_stack_fffffffffffffcf8;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  reference local_248;
  reference local_240;
  BlockInfo *local_238;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_230;
  reference local_228;
  byte local_219;
  unsigned_long *local_218;
  unsigned_long *local_210;
  unsigned_long *local_208;
  unsigned_long *local_200;
  unsigned_long *local_1f8;
  unsigned_long *local_1f0;
  undefined1 local_1e8 [48];
  undefined1 local_1b8 [31];
  undefined1 local_199 [40];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  reference local_100;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  undefined1 local_69 [33];
  reference local_48;
  BlockInfo *local_40;
  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_38;
  reference local_30;
  byte local_21;
  void *local_18;
  long local_10;
  
  local_10 = in_RSI;
  if (*(int *)(in_RSI + 0x28) == 0xe) {
    local_21 = 0;
    local_30 = std::
               vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
               ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                             *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
    local_38._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin(in_stack_fffffffffffffc08);
    local_40 = (BlockInfo *)
               std::
               vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
               ::end(in_stack_fffffffffffffc08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffc08), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                 ::operator*(&local_38);
      _Var2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (_Var2) {
        sVar4 = local_48->bufferCount;
        uVar3 = std::__cxx11::string::size();
        if (sVar4 < uVar3) {
          in_stack_fffffffffffffce0 = (Buffer *)local_69;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_69 + 1),"Engine",(allocator *)in_stack_fffffffffffffce0);
          in_stack_fffffffffffffcd8 = &local_a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,"SSCWriter",in_stack_fffffffffffffcd8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"PutDeferredCommon",&local_c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_f0,"SSC only accepts fixed length string variables",&local_f1);
          helper::Throw<std::invalid_argument>
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          std::__cxx11::string::~string((string *)(local_69 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_69);
        }
        puVar5 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
        sVar4 = local_48->bufferStart;
        pvVar6 = (void *)std::__cxx11::string::data();
        sVar7 = std::__cxx11::string::size();
        memcpy(puVar5 + sVar4,pvVar6,sVar7);
        local_21 = 1;
      }
      __gnu_cxx::
      __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_38);
    }
    if ((local_21 & 1) == 0) {
      if (((*(long *)(in_RDI + 0x50) == 0) || ((*(byte *)(in_RDI + 0x158) & 1) == 0)) ||
         ((*(byte *)(in_RDI + 0x159) & 1) == 0)) {
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                      *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::emplace_back<>(in_stack_fffffffffffffc10);
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                      *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
        local_100 = std::
                    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    ::back(in_stack_fffffffffffffc10);
        std::__cxx11::string::operator=((string *)local_100,(string *)(local_10 + 8));
        local_100->type = String;
        local_100->shapeId = *(ShapeID *)(local_10 + 0x40);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        sVar4 = Buffer::size((Buffer *)(in_RDI + 0x38));
        local_100->bufferStart = sVar4;
        sVar4 = std::__cxx11::string::size();
        local_100->bufferCount = sVar4;
        Buffer::resize(in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
        puVar5 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
        sVar4 = local_100->bufferStart;
        pvVar6 = (void *)std::__cxx11::string::data();
        sVar7 = std::__cxx11::string::size();
        memcpy(puVar5 + sVar4,pvVar6,sVar7);
        std::__cxx11::string::size();
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc30,
                   (size_type)in_stack_fffffffffffffc28);
        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d28c2);
        pvVar6 = (void *)std::__cxx11::string::data();
        sVar7 = std::__cxx11::string::size();
        memcpy(pcVar8,pvVar6,sVar7);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"Engine",&local_121);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"SSCWriter",&local_149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"PutDeferredCommon",&local_171);
        component = (string *)local_199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_199 + 1),"IO pattern changed after locking",
                   (allocator *)component);
        helper::Throw<std::invalid_argument>
                  (component,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
    }
  }
  else if ((((*(int *)(in_RSI + 0x40) != 1) && (*(int *)(in_RSI + 0x40) != 4)) &&
           (*(int *)(in_RSI + 0x28) != 0xe)) || (*(int *)(in_RDI + 0x28) == 0)) {
    local_18 = in_RDX;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc60,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc58);
    if (*(int *)(*(long *)(in_RDI + 0x88) + 0x58) != 0) {
      in_stack_fffffffffffffc68 = (string *)local_1b8;
      local_1f0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      local_1f8 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc60 = (string *)(local_1e8 + 0x18);
      local_200 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      local_208 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc58 = (string *)local_1e8;
      local_210 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      local_218 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc08);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    }
    local_219 = 0;
    local_228 = std::
                vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                              *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
    local_230._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin(in_stack_fffffffffffffc08);
    local_238 = (BlockInfo *)
                std::
                vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                ::end(in_stack_fffffffffffffc08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_fffffffffffffc08), bVar1) {
      local_240 = __gnu_cxx::
                  __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                  ::operator*(&local_230);
      _Var2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (_Var2) {
        bVar1 = AreSameDims((Dims *)in_stack_fffffffffffffc28,
                            (Dims *)in_stack_fffffffffffffc20._M_current);
        in_stack_fffffffffffffc54 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc54);
        if (bVar1) {
          bVar1 = AreSameDims((Dims *)in_stack_fffffffffffffc28,
                              (Dims *)in_stack_fffffffffffffc20._M_current);
          in_stack_fffffffffffffc54 =
               CONCAT13((char)((uint)in_stack_fffffffffffffc54 >> 0x18),
                        CONCAT12(bVar1,(short)in_stack_fffffffffffffc54));
          if (bVar1) {
            bVar1 = AreSameDims((Dims *)in_stack_fffffffffffffc28,
                                (Dims *)in_stack_fffffffffffffc20._M_current);
            in_stack_fffffffffffffc54 =
                 CONCAT22((short)((uint)in_stack_fffffffffffffc54 >> 0x10),
                          CONCAT11(bVar1,(char)in_stack_fffffffffffffc54));
            if (bVar1) {
              puVar5 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
              memcpy(puVar5 + local_240->bufferStart,local_18,local_240->bufferCount);
              local_219 = 1;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_230);
    }
    if ((local_219 & 1) == 0) {
      if (((*(long *)(in_RDI + 0x50) == 0) || ((*(byte *)(in_RDI + 0x158) & 1) == 0)) ||
         ((*(byte *)(in_RDI + 0x159) & 1) == 0)) {
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                      *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
        std::
        vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
        ::emplace_back<>(in_stack_fffffffffffffc10);
        std::
        vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
        ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                      *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
        local_248 = std::
                    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    ::back(in_stack_fffffffffffffc10);
        std::__cxx11::string::operator=((string *)local_248,(string *)(local_10 + 8));
        local_248->type = *(DataType *)(local_10 + 0x28);
        local_248->shapeId = *(ShapeID *)(local_10 + 0x40);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_248->elementSize = *(size_t *)(local_10 + 0x30);
        sVar4 = Buffer::size((Buffer *)(in_RDI + 0x38));
        local_248->bufferStart = sVar4;
        sVar4 = TotalDataSize(in_stack_fffffffffffffcf8,in_RDI,in_stack_fffffffffffffce8);
        local_248->bufferCount = sVar4;
        Buffer::resize(in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
        this_00 = (vector<char,_std::allocator<char>_> *)Buffer::data((Buffer *)(in_RDI + 0x38),0);
        memcpy(&(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Tp_alloc_type + local_248->bufferStart,local_18,local_248->bufferCount);
        if ((local_248->shapeId == GlobalValue) || (local_248->shapeId == LocalValue)) {
          std::vector<char,_std::allocator<char>_>::resize
                    (this_00,(size_type)in_stack_fffffffffffffc28);
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x1d3118);
          memcpy(pcVar8,local_18,local_248->bufferCount);
        }
        if (*(int *)(local_10 + 0x28) == 0x10) {
          adios2::core::StructDefinition::StructName_abi_cxx11_();
          std::__cxx11::string::operator=((string *)&local_248->structDef,local_268);
          std::__cxx11::string::~string(local_268);
        }
      }
      else {
        paVar9 = &local_289;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_288,"Engine",paVar9);
        in_stack_fffffffffffffc20._M_current = (unsigned_long *)&local_2b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2b0,"SSCWriter",(allocator *)in_stack_fffffffffffffc20._M_current);
        paVar9 = &local_2d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"PutDeferredCommon",paVar9);
        paVar9 = (allocator *)&stack0xfffffffffffffcff;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_300,"IO pattern changed after locking",paVar9);
        helper::Throw<std::invalid_argument>
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
        std::__cxx11::string::~string(local_300);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcff);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffc20._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffc20._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffc20._M_current);
  }
  return;
}

Assistant:

void SscWriterGeneric::PutDeferred(VariableBase &variable, const void *data)
{
    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        bool found = false;
        for (const auto &b : m_GlobalWritePattern[m_StreamRank])
        {
            if (b.name == variable.m_Name)
            {
                if (b.bufferCount < dataString->size())
                {
                    helper::Throw<std::invalid_argument>(
                        "Engine", "SSCWriter", "PutDeferredCommon",
                        "SSC only accepts fixed length string variables");
                }
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                found = true;
            }
        }

        if (!found)
        {
            if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
                m_ReaderSelectionsLocked == false)
            {
                m_GlobalWritePattern[m_StreamRank].emplace_back();
                auto &b = m_GlobalWritePattern[m_StreamRank].back();
                b.name = variable.m_Name;
                b.type = DataType::String;
                b.shapeId = variable.m_ShapeID;
                b.shape = variable.m_Shape;
                b.start = variable.m_Start;
                b.count = variable.m_Count;
                b.bufferStart = m_Buffer.size();
                b.bufferCount = dataString->size();
                m_Buffer.resize(b.bufferStart + b.bufferCount);
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                b.value.resize(dataString->size());
                std::memcpy(b.value.data(), dataString->data(), dataString->size());
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                     "IO pattern changed after locking");
            }
        }
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_GlobalWritePattern[m_StreamRank])
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            m_GlobalWritePattern[m_StreamRank].emplace_back();
            auto &b = m_GlobalWritePattern[m_StreamRank].back();
            b.name = variable.m_Name;
            b.type = variable.m_Type;
            b.shapeId = variable.m_ShapeID;
            b.shape = vShape;
            b.start = vStart;
            b.count = vCount;
            b.elementSize = variable.m_ElementSize;
            b.bufferStart = m_Buffer.size();
            b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
            m_Buffer.resize(b.bufferStart + b.bufferCount);
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
            {
                b.value.resize(variable.m_ElementSize);
                std::memcpy(b.value.data(), data, b.bufferCount);
            }
            if (variable.m_Type == DataType::Struct)
            {
                b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                                  ->m_WriteStructDefinition->StructName();
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                 "IO pattern changed after locking");
        }
    }
}